

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_bool32 ma_dr_wav_preinit_write
                    (ma_dr_wav *pWav,ma_dr_wav_data_format *pFormat,ma_bool32 isSequential,
                    ma_dr_wav_write_proc onWrite,ma_dr_wav_seek_proc onSeek,void *pUserData,
                    ma_allocation_callbacks *pAllocationCallbacks)

{
  long in_RCX;
  int in_EDX;
  long in_RSI;
  void *in_RDI;
  long in_R8;
  undefined8 in_R9;
  ma_allocation_callbacks *in_stack_00000008;
  ma_allocation_callbacks local_58;
  undefined8 local_38;
  long local_30;
  long local_28;
  int local_1c;
  long local_18;
  void *local_10;
  ma_bool32 local_4;
  
  if ((in_RDI == (void *)0x0) || (in_RCX == 0)) {
    local_4 = 0;
  }
  else if ((in_EDX == 0) && (in_R8 == 0)) {
    local_4 = 0;
  }
  else if (*(int *)(in_RSI + 4) == 0xfffe) {
    local_4 = 0;
  }
  else if ((*(int *)(in_RSI + 4) == 2) || (*(int *)(in_RSI + 4) == 0x11)) {
    local_4 = 0;
  }
  else {
    local_38 = in_R9;
    local_30 = in_R8;
    local_28 = in_RCX;
    local_1c = in_EDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    memset(in_RDI,0,400);
    *(long *)((long)local_10 + 8) = local_28;
    *(long *)((long)local_10 + 0x10) = local_30;
    *(undefined8 *)((long)local_10 + 0x18) = local_38;
    ma_dr_wav_copy_allocation_callbacks_or_defaults(&local_58,in_stack_00000008);
    *(void **)((long)local_10 + 0x20) = local_58.pUserData;
    *(_func_void_ptr_size_t_void_ptr **)((long)local_10 + 0x28) = local_58.onMalloc;
    *(_func_void_ptr_void_ptr_size_t_void_ptr **)((long)local_10 + 0x30) = local_58.onRealloc;
    *(_func_void_void_ptr_void_ptr **)((long)local_10 + 0x38) = local_58.onFree;
    if ((*(long *)((long)local_10 + 0x38) == 0) ||
       ((*(long *)((long)local_10 + 0x28) == 0 && (*(long *)((long)local_10 + 0x30) == 0)))) {
      local_4 = 0;
    }
    else {
      *(short *)((long)local_10 + 0x44) = (short)*(undefined4 *)(local_18 + 4);
      *(short *)((long)local_10 + 0x46) = (short)*(undefined4 *)(local_18 + 8);
      *(undefined4 *)((long)local_10 + 0x48) = *(undefined4 *)(local_18 + 0xc);
      *(uint *)((long)local_10 + 0x4c) =
           (uint)(*(int *)(local_18 + 0x10) * *(int *)(local_18 + 0xc) * *(int *)(local_18 + 8)) >>
           3;
      *(short *)((long)local_10 + 0x50) =
           (short)((uint)(*(int *)(local_18 + 8) * *(int *)(local_18 + 0x10)) >> 3);
      *(short *)((long)local_10 + 0x52) = (short)*(undefined4 *)(local_18 + 0x10);
      *(undefined2 *)((long)local_10 + 0x54) = 0;
      *(int *)((long)local_10 + 0xa8) = local_1c;
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

MA_PRIVATE ma_bool32 ma_dr_wav_preinit_write(ma_dr_wav* pWav, const ma_dr_wav_data_format* pFormat, ma_bool32 isSequential, ma_dr_wav_write_proc onWrite, ma_dr_wav_seek_proc onSeek, void* pUserData, const ma_allocation_callbacks* pAllocationCallbacks)
{
    if (pWav == NULL || onWrite == NULL) {
        return MA_FALSE;
    }
    if (!isSequential && onSeek == NULL) {
        return MA_FALSE;
    }
    if (pFormat->format == MA_DR_WAVE_FORMAT_EXTENSIBLE) {
        return MA_FALSE;
    }
    if (pFormat->format == MA_DR_WAVE_FORMAT_ADPCM || pFormat->format == MA_DR_WAVE_FORMAT_DVI_ADPCM) {
        return MA_FALSE;
    }
    MA_DR_WAV_ZERO_MEMORY(pWav, sizeof(*pWav));
    pWav->onWrite   = onWrite;
    pWav->onSeek    = onSeek;
    pWav->pUserData = pUserData;
    pWav->allocationCallbacks = ma_dr_wav_copy_allocation_callbacks_or_defaults(pAllocationCallbacks);
    if (pWav->allocationCallbacks.onFree == NULL || (pWav->allocationCallbacks.onMalloc == NULL && pWav->allocationCallbacks.onRealloc == NULL)) {
        return MA_FALSE;
    }
    pWav->fmt.formatTag = (ma_uint16)pFormat->format;
    pWav->fmt.channels = (ma_uint16)pFormat->channels;
    pWav->fmt.sampleRate = pFormat->sampleRate;
    pWav->fmt.avgBytesPerSec = (ma_uint32)((pFormat->bitsPerSample * pFormat->sampleRate * pFormat->channels) / 8);
    pWav->fmt.blockAlign = (ma_uint16)((pFormat->channels * pFormat->bitsPerSample) / 8);
    pWav->fmt.bitsPerSample = (ma_uint16)pFormat->bitsPerSample;
    pWav->fmt.extendedSize = 0;
    pWav->isSequentialWrite = isSequential;
    return MA_TRUE;
}